

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::PopulateTcParseFastEntries
          (Reflection *this,TailCallTableInfo *table_info,FastFieldEntry *fast_entries)

{
  __index_type _Var1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  pointer pFVar5;
  uint32_t uVar6;
  uint64_t uVar7;
  pointer pFVar8;
  code *pcVar9;
  
  pFVar8 = (table_info->fast_path_fields).
           super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar5 = (table_info->fast_path_fields).
           super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pFVar8 != pFVar5) {
    do {
      _Var1 = *(__index_type *)
               ((long)&(pFVar8->data).
                       super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                       .
                       super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                       .
                       super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                       .
                       super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                       .
                       super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                       .
                       super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
               + 0x18);
      if (pFVar8 == (pointer)0x0 || _Var1 != '\x02') {
        if (pFVar8 == (pointer)0x0 || _Var1 != '\x01') {
          if (_Var1 != '\0') {
            PopulateTcParseFastEntries();
          }
          pcVar9 = internal::TcParser::MiniParse;
          uVar7 = 0;
        }
        else {
          pcVar9 = GetFastParseFunction
                             (*(TcParseFunction *)
                               &(pFVar8->data).
                                super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                                .
                                super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                                .
                                super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                                .
                                super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                                .
                                super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                                .
                                super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                             );
          uVar4 = *(ushort *)
                   ((long)&(pFVar8->data).
                           super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                           .
                           super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                           .
                           super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                           .
                           super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                           .
                           super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                           .
                           super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                   + 0x10);
          bVar2 = *(byte *)((long)&(pFVar8->data).
                                   super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                                   .
                                   super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                                   .
                                   super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                                   .
                                   super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                                   .
                                   super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                                   .
                                   super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                           + 0x12);
          bVar3 = *(byte *)((long)&(pFVar8->data).
                                   super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                                   .
                                   super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                                   .
                                   super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                                   .
                                   super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                                   .
                                   super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                                   .
                                   super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                           + 0x13);
          uVar6 = internal::ReflectionSchema::GetFieldOffset
                            (&this->schema_,
                             *(FieldDescriptor **)
                              ((long)&(pFVar8->data).
                                      super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                                      .
                                      super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                                      .
                                      super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                                      .
                                      super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                                      .
                                      super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                                      .
                                      super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                              + 8));
          uVar7 = ((ulong)bVar2 << 0x10 | (ulong)bVar3 << 0x18 | (ulong)uVar6 << 0x30) +
                  (ulong)uVar4;
        }
      }
      else {
        pcVar9 = GetFastParseFunction
                           (*(TcParseFunction *)
                             &(pFVar8->data).
                              super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                              .
                              super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                              .
                              super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                              .
                              super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                              .
                              super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                              .
                              super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                           );
        uVar7 = (uint64_t)
                *(uint *)((long)&(pFVar8->data).
                                 super__Variant_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                                 .
                                 super__Move_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                                 .
                                 super__Copy_assign_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                                 .
                                 super__Move_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                                 .
                                 super__Copy_ctor_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                                 .
                                 super__Variant_storage_alias<google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Empty,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::Field,_google::protobuf::internal::TailCallTableInfo::FastFieldInfo::NonField>
                         + 2);
      }
      (fast_entries->target_atomic)._M_b._M_p = pcVar9;
      (fast_entries->bits).field_0.data = uVar7;
      fast_entries = fast_entries + 1;
      pFVar8 = pFVar8 + 1;
    } while (pFVar8 != pFVar5);
  }
  return;
}

Assistant:

void Reflection::PopulateTcParseFastEntries(
    const internal::TailCallTableInfo& table_info,
    TcParseTableBase::FastFieldEntry* fast_entries) const {
  for (const auto& fast_field : table_info.fast_path_fields) {
    if (auto* nonfield = fast_field.AsNonField()) {
      // No field, but still a special entry.
      *fast_entries++ = {GetFastParseFunction(nonfield->func),
                         {nonfield->coded_tag, nonfield->nonfield_info}};
    } else if (auto* as_field = fast_field.AsField()) {
      *fast_entries++ = {
          GetFastParseFunction(as_field->func),
          {as_field->coded_tag, as_field->hasbit_idx, as_field->aux_idx,
           static_cast<uint16_t>(schema_.GetFieldOffset(as_field->field))}};
    } else {
      ABSL_DCHECK(fast_field.is_empty());
      // No fast entry here. Use mini parser.
      *fast_entries++ = {internal::TcParser::MiniParse, {}};
    }
  }
}